

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O3

v3i idx2::GetSpatialBrick(idx2_file *Idx2,int Level,u64 LinearBrick)

{
  byte *pbVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  v3i vVar6;
  v3i Brick3;
  uint auStack_36c [211];
  code *pcStack_20;
  undefined8 local_c;
  int local_4;
  
  pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
  uVar3 = (ulong)pbVar1[(long)Level * 0x81 + 0x80];
  local_c = 0;
  local_4 = 0;
  if (uVar3 == 0) {
    local_4 = 0;
    uVar2 = 0;
  }
  else {
    lVar4 = 0;
    do {
      uVar3 = uVar3 - 1;
      if (lVar4 == 0x80) {
        pcStack_20 = (code *)0x181e27;
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
      }
      lVar5 = (long)(char)pbVar1[lVar4 + (long)Level * 0x81];
      if (0x5a < lVar5) {
        pcStack_20 = ChunkAddressToSpatial;
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      auStack_36c[lVar5 + 0x80] =
           ((uint)((LinearBrick >> (uVar3 & 0x3f) & 1) != 0) | auStack_36c[lVar5 + 0x80]) * 2;
      lVar4 = lVar4 + 1;
    } while (uVar3 != 0);
    local_4 = local_4 >> 1;
    uVar2 = CONCAT44(local_c._4_4_ >> 1,(int)local_c >> 1);
  }
  vVar6.field_0.field_0.Z = local_4;
  vVar6.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)uVar2;
  return (v3i)vVar6.field_0;
}

Assistant:

v3i
GetSpatialBrick(const idx2_file& Idx2, int Level, u64 LinearBrick)
{
  int Size = Idx2.BricksOrderStr[Level].Len;
  v3i Brick3(0);
  for (int I = 0; I < Size; ++I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    int J = Size - I - 1;
    Brick3[D] |= (LinearBrick & (u64(1) << J)) >> J;
    Brick3[D] <<= 1;
  }
  return Brick3 >> 1;
}